

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

IShaderResourceVariable * __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::GetStaticVariableByIndex
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType,Uint32 Index
          )

{
  undefined *puVar1;
  SHADER_TYPE SVar2;
  undefined8 uVar3;
  PipelineResourceSignatureImplType *this_00;
  char (*in_stack_ffffffffffffff68) [3];
  Char *local_78;
  undefined1 local_70 [8];
  string _msg_1;
  undefined1 local_40 [8];
  string _msg;
  Uint32 Index_local;
  SHADER_TYPE ShaderType_local;
  PipelineStateBase<Diligent::EngineGLImplTraits> *this_local;
  
  _msg.field_2._8_4_ = Index;
  _msg.field_2._12_4_ = ShaderType;
  CheckPipelineReady(this);
  if ((this->m_UsingImplicitSignature & 1U) == 0) {
    FormatString<char[175]>
              ((string *)local_40,
               (char (*) [175])
               "IPipelineState::GetStaticVariableByIndex is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::GetStaticVariableByIndex instead."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_40);
    this_local = (PipelineStateBase<Diligent::EngineGLImplTraits> *)0x0;
  }
  else {
    SVar2 = Diligent::operator&(this->m_ActiveShaderStages,_msg.field_2._12_4_);
    if (SVar2 == SHADER_TYPE_UNKNOWN) {
      local_78 = GetShaderTypeLiteralName(_msg.field_2._12_4_);
      FormatString<char[40],unsigned_int,char[18],char_const*,char[35],char_const*,char[3]>
                ((string *)local_70,(Diligent *)"Unable to get static variable at index ",
                 (char (*) [40])((long)&_msg.field_2 + 8),(uint *)0x465058,(char (*) [18])&local_78,
                 (char **)" as the stage is inactive in PSO \'",
                 (char (*) [35])
                 &(this->
                  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                  ).m_Desc,(char **)"\'.",in_stack_ffffffffffffff68);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_70);
      this_local = (PipelineStateBase<Diligent::EngineGLImplTraits> *)0x0;
    }
    else {
      this_00 = GetResourceSignature(this,0);
      this_local = (PipelineStateBase<Diligent::EngineGLImplTraits> *)
                   PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::
                   GetStaticVariableByIndex
                             (&this_00->
                               super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                              _msg.field_2._12_4_,_msg.field_2._8_4_);
    }
  }
  return (IShaderResourceVariable *)this_local;
}

Assistant:

GetStaticVariableByIndex(SHADER_TYPE ShaderType,
                                                                                 Uint32      Index) override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::GetStaticVariableByIndex is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::GetStaticVariableByIndex instead.");
            return nullptr;
        }

        if ((m_ActiveShaderStages & ShaderType) == 0)
        {
            LOG_WARNING_MESSAGE("Unable to get static variable at index ", Index, " in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is inactive in PSO '", this->m_Desc.Name, "'.");
            return nullptr;
        }

        return this->GetResourceSignature(0)->GetStaticVariableByIndex(ShaderType, Index);
    }